

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ACS.cpp
# Opt level: O3

void __thiscall imrt::ACS::printProbability(ACS *this)

{
  int iVar1;
  ostream *poVar2;
  mapped_type *pmVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  key_type_conflict local_44;
  long local_40;
  long local_38;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Intensity probabilities:",0x18);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
  std::ostream::put(-0x78);
  std::ostream::flush();
  iVar1 = Collimator::getNbAngles((this->super_ACO).collimator);
  if (0 < iVar1) {
    local_40 = 0;
    do {
      lVar5 = local_40;
      if (0 < (this->super_ACO).max_apertures) {
        lVar4 = 0;
        do {
          iVar1 = Collimator::getIntensityLevelSize((this->super_ACO).collimator);
          if (0 < iVar1) {
            lVar6 = 0;
            do {
              poVar2 = std::ostream::_M_insert<double>
                                 ((this->super_ACO).iprobability.
                                  super__Vector_base<maths::Matrix,_std::allocator<maths::Matrix>_>.
                                  _M_impl.super__Vector_impl_data._M_start[lVar5].p[lVar4][lVar6]);
              std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
              lVar6 = lVar6 + 1;
              iVar1 = Collimator::getIntensityLevelSize((this->super_ACO).collimator);
            } while (lVar6 < iVar1);
          }
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
          std::ostream::put(-0x78);
          std::ostream::flush();
          lVar4 = lVar4 + 1;
        } while (lVar4 < (this->super_ACO).max_apertures);
      }
      lVar5 = local_40 + 1;
      iVar1 = Collimator::getNbAngles((this->super_ACO).collimator);
      local_40 = lVar5;
    } while (lVar5 < iVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Aperture probabilities:",0x17);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
  std::ostream::put(-0x78);
  std::ostream::flush();
  iVar1 = Collimator::getNbAngles((this->super_ACO).collimator);
  if (0 < iVar1) {
    local_38 = 0;
    do {
      local_44 = 0;
      if (0 < (this->super_ACO).max_apertures) {
        local_40 = local_38 * 0x30;
        do {
          iVar1 = Collimator::getXdim((this->super_ACO).collimator);
          if (0 < iVar1) {
            lVar5 = 0;
            do {
              iVar1 = Collimator::getReferenceSize((this->super_ACO).collimator);
              lVar4 = local_40;
              if (0 < iVar1) {
                lVar6 = 0;
                do {
                  pmVar3 = std::
                           map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>
                           ::operator[]((map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>
                                         *)((long)&(((this->super_ACO).probability.
                                                                                                          
                                                  super__Vector_base<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>,_std::allocator<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                                                  _M_impl.field_0x0 + lVar4),&local_44);
                  poVar2 = std::ostream::_M_insert<double>(pmVar3->p[lVar5][lVar6]);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
                  lVar6 = lVar6 + 1;
                  iVar1 = Collimator::getReferenceSize((this->super_ACO).collimator);
                } while (lVar6 < iVar1);
              }
              std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
              std::ostream::put(-0x78);
              std::ostream::flush();
              lVar5 = lVar5 + 1;
              iVar1 = Collimator::getXdim((this->super_ACO).collimator);
            } while (lVar5 < iVar1);
          }
          local_44 = local_44 + 1;
        } while (local_44 < (this->super_ACO).max_apertures);
      }
      lVar5 = local_38 + 1;
      iVar1 = Collimator::getNbAngles((this->super_ACO).collimator);
      local_38 = lVar5;
    } while (lVar5 < iVar1);
  }
  return;
}

Assistant:

void ACS::printProbability() {
    cout << "Intensity probabilities:"<< endl;
    for (int s = 0; s < collimator.getNbAngles(); s++) {
      for (int a = 0; a < max_apertures; a++) {
          for (int i = 0; i <  collimator.getIntensityLevelSize();i++) {
            cout << iprobability[s](a,i) << " ";
        }
        cout << endl;
      }
    }
    cout << "Aperture probabilities:" << endl;
    for (int s = 0; s < collimator.getNbAngles(); s++) {
      for (int a = 0; a < max_apertures; a++) {
        for (int j = 0; j < collimator.getXdim(); j++) {
          for (int r = 0; r < collimator.getReferenceSize(); r++) {
            cout << probability[s][a](j,r) <<  " ";
          }
          cout << endl;
        }
      }
    }
  }